

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O3

void __thiscall
pbrt::SobolSampler::SobolSampler
          (SobolSampler *this,int samplesPerPixel,Point2i *fullResolution,
          RandomizeStrategy randomizeStrategy)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  string ret;
  int local_3c;
  string local_38;
  
  this->samplesPerPixel = samplesPerPixel;
  this->randomizeStrategy = randomizeStrategy;
  (this->pixel).super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)0x0;
  if (POPCOUNT(samplesPerPixel) != 1) {
    local_38._M_string_length = 0;
    local_38.field_2._M_local_buf[0] = '\0';
    local_3c = samplesPerPixel;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    detail::stringPrintfRecursive<int&>
              (&local_38,
               "Non power-of-two sample count %d will perform sub-optimally with the SobolSampler.",
               &local_3c);
    Warning((FileLoc *)0x0,local_38._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,
                      CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,
                               local_38.field_2._M_local_buf[0]) + 1);
    }
  }
  iVar1 = (fullResolution->super_Tuple2<pbrt::Point2,_int>).x;
  iVar3 = (fullResolution->super_Tuple2<pbrt::Point2,_int>).y;
  if (iVar3 < iVar1) {
    iVar3 = iVar1;
  }
  uVar2 = (int)(iVar3 - 1U) >> 1 | iVar3 - 1U;
  uVar2 = (int)uVar2 >> 2 | uVar2;
  uVar2 = (int)uVar2 >> 4 | uVar2;
  uVar2 = (int)uVar2 >> 8 | uVar2;
  this->scale = ((int)uVar2 >> 0x10 | uVar2) + 1;
  return;
}

Assistant:

SobolSampler(int samplesPerPixel, const Point2i &fullResolution,
                 RandomizeStrategy randomizeStrategy)
        : samplesPerPixel(samplesPerPixel), randomizeStrategy(randomizeStrategy) {
        if (!IsPowerOf2(samplesPerPixel))
            Warning("Non power-of-two sample count %d will perform sub-optimally with "
                    "the SobolSampler.",
                    samplesPerPixel);
        scale = RoundUpPow2(std::max(fullResolution.x, fullResolution.y));
    }